

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall
ON_PolyCurve::GetNextDiscontinuity
          (ON_PolyCurve *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  double dVar1;
  ON_3dVector Km_00;
  ON_3dVector Km_01;
  ON_3dVector Kp_00;
  ON_3dVector Kp_01;
  double adVar2 [2];
  bool bVar3;
  bool bVar4;
  continuity cVar5;
  int cv_count;
  int iVar6;
  uint uVar7;
  double *pdVar8;
  ON_Curve **ppOVar9;
  ON_ArcCurve *pOVar10;
  ON_ArcCurve *pOVar11;
  double dVar12;
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  double adVar17 [2];
  continuity local_3c4;
  bool local_3bd;
  int local_334;
  continuity local_32c;
  int tindex;
  bool b1;
  bool b0;
  ON_Curve *seg1;
  ON_Curve *seg0;
  double is_linear_min_length;
  double is_linear_tolerance;
  ON_ArcCurve *arc1;
  ON_ArcCurve *arc0;
  bool local_281;
  undefined1 local_280 [7];
  bool bIsCurvatureContinuous;
  ON_3dVector local_268;
  ON_3dVector local_250;
  ON_Interval local_238;
  ON_Interval local_228;
  int local_214;
  double dStack_210;
  int crv0_side;
  double crv1_t;
  double crv0_t;
  ON_Curve *crv1;
  double dStack_1f0;
  int next_segment_index;
  double s_tol;
  double e;
  double t_tol;
  double kink_t;
  double local_1c8;
  ON_Object *local_1c0;
  ON_Curve *crv;
  double dStack_1b0;
  int segment_index_delta;
  double tmax;
  double tmin;
  double segtol;
  continuity local_190;
  int segment_index;
  continuity input_c;
  int curve_hint;
  int segment_hint;
  int count;
  ON_Interval cdom;
  ON_Interval sdom;
  double dStack_158;
  bool rc;
  double s;
  double s1;
  double s0;
  ON_3dVector Kp;
  ON_3dVector Km;
  ON_3dVector Tp;
  ON_3dVector Tm;
  ON_3dVector D2p;
  ON_3dVector D2m;
  ON_3dVector D1p;
  ON_3dVector D1m;
  ON_3dPoint Pp;
  ON_3dPoint Pm;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  int *dtype_local;
  int *hint_local;
  double *t_local;
  double t1_local;
  double t0_local;
  continuity c_local;
  ON_PolyCurve *this_local;
  
  sdom.m_t[1]._7_1_ = false;
  ON_Interval::ON_Interval((ON_Interval *)(cdom.m_t + 1));
  ON_Interval::ON_Interval((ON_Interval *)&segment_hint);
  curve_hint = Count(this);
  input_c = unknown_continuity;
  segment_index = 0;
  if (dtype != (int *)0x0) {
    *dtype = 0;
  }
  if ((curve_hint < 1) || ((t0 == t1 && (!NAN(t0) && !NAN(t1))))) {
    return false;
  }
  local_190 = c;
  cVar5 = ON::ParametricContinuity(c);
  if (hint == (int *)0x0) {
    local_32c = unknown_continuity;
  }
  else {
    local_32c = *hint & 0x3fff;
  }
  input_c = local_32c;
  cv_count = curve_hint + 1;
  pdVar8 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
  iVar6 = 1;
  if (t1 < t0) {
    iVar6 = -1;
  }
  segtol._4_4_ = ON_NurbsSpanIndex(2,cv_count,pdVar8,t0,iVar6,input_c);
  if ((hint == (int *)0x0) || (input_c != segtol._4_4_)) {
    local_334 = 0;
  }
  else {
    local_334 = *hint >> 0xe;
  }
  segment_index = local_334;
  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
  dVar12 = *pdVar8;
  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + C0_continuous);
  dVar13 = *pdVar8;
  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + C0_continuous);
  dVar1 = *pdVar8;
  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
  tmin = (ABS(dVar12) + ABS(dVar13) + ABS(dVar1 - *pdVar8)) * 1.490116119385e-08;
  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
  dVar12 = *pdVar8 + tmin;
  pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + C0_continuous);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar12;
  t1_local = t0;
  if (dVar12 < *pdVar8 - tmin) {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = t0;
    if (t1 <= t0) {
      pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
      if (*pdVar8 <= t0 && t0 != *pdVar8) {
        pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = t1;
        if (t1 < *pdVar8) {
          pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
          auVar16._0_8_ = t0 - *pdVar8;
          auVar16._8_8_ = 0;
          auVar15 = auVar16 & _DAT_009d3010;
          if ((auVar15._0_8_ <= tmin) && (0 < (int)segtol._4_4_)) {
            pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
            t1_local = *pdVar8;
          }
        }
      }
    }
    else {
      pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + C0_continuous);
      auVar15._8_8_ = 0;
      if ((t0 < *pdVar8) &&
         (pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + C0_continuous),
         *pdVar8 <= t1 && t1 != *pdVar8)) {
        pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + C0_continuous);
        auVar14._0_8_ = t0 - *pdVar8;
        auVar14._8_8_ = 0;
        auVar15 = auVar14 & _DAT_009d3010;
        if ((auVar15._0_8_ <= tmin) && ((int)(segtol._4_4_ + C0_continuous) < curve_hint)) {
          pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + C0_continuous);
          t1_local = *pdVar8;
          iVar6 = curve_hint + 1;
          pdVar8 = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
          segtol._4_4_ = ON_NurbsSpanIndex(2,iVar6,pdVar8,t1_local,1,input_c);
        }
      }
    }
  }
  adVar2[1] = local_228.m_t[1];
  adVar2[0] = local_228.m_t[0];
  adVar17[1] = local_238.m_t[1];
  adVar17[0] = local_238.m_t[0];
  if (t1_local <= t1) {
    crv._4_4_ = 1;
    tmax = t1_local;
    dStack_1b0 = t1;
  }
  else {
    crv._4_4_ = -1;
    dStack_1b0 = t1_local;
    tmax = t1;
    local_238.m_t = adVar17;
    local_228.m_t = adVar2;
  }
  do {
    dVar13 = tmax;
    bVar4 = false;
    dVar12 = auVar15._0_8_;
    if ((-1 < (int)segtol._4_4_) && (bVar4 = false, (int)segtol._4_4_ < curve_hint)) {
      pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + C0_continuous);
      bVar4 = false;
      dVar12 = dVar13;
      if (dVar13 < *pdVar8) {
        pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
        dVar12 = *pdVar8;
        bVar4 = dVar12 < dStack_1b0;
      }
    }
    if (!bVar4) goto LAB_007fdf08;
    ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segtol._4_4_);
    local_1c0 = (ON_Object *)*ppOVar9;
    if (local_1c0 == (ON_Object *)0x0) goto LAB_007fdf08;
    (*(((ON_Geometry *)&local_1c0->_vptr_ON_Object)->super_ON_Object)._vptr_ON_Object[0x25])();
    local_1c8 = dVar12;
    cdom.m_t[0] = dVar12;
    pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_);
    dVar12 = *pdVar8;
    pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,segtol._4_4_ + C0_continuous);
    ON_Interval::Set((ON_Interval *)(cdom.m_t + 1),dVar12,*pdVar8);
    s1 = ON_Interval::TransformParameterTo
                   ((ON_Interval *)(cdom.m_t + 1),(ON_Interval *)&segment_hint,t1_local);
    s = ON_Interval::TransformParameterTo
                  ((ON_Interval *)(cdom.m_t + 1),(ON_Interval *)&segment_hint,t1);
    uVar7 = (*(((ON_Geometry *)&local_1c0->_vptr_ON_Object)->super_ON_Object)._vptr_ON_Object[0x36])
                      (s1,s,SUB84(cos_angle_tolerance,0),curvature_tolerance,local_1c0,(ulong)cVar5,
                       &stack0xfffffffffffffea8,&segment_index,dtype);
    sdom.m_t[1]._7_1_ = (bool)((byte)uVar7 & 1);
    if ((uVar7 & 1) != 0) {
      bVar4 = ON_Interval::operator==((ON_Interval *)(cdom.m_t + 1),(ON_Interval *)&segment_hint);
      if (bVar4) {
        t_tol = dStack_158;
      }
      else {
        t_tol = ON_Interval::TransformParameterTo
                          ((ON_Interval *)&segment_hint,(ON_Interval *)(cdom.m_t + 1),dStack_158);
        e = (ABS(t1_local) + ABS(t1) + ABS(t1_local - t1)) * 2.3283064365386963e-10;
        if ((t_tol <= tmax + e) || (dStack_1b0 - e <= t_tol)) {
          dVar12 = ON_Interval::Length((ON_Interval *)(cdom.m_t + 1));
          dVar13 = ON_Interval::Length((ON_Interval *)&segment_hint);
          s_tol = ABS(dVar12 / dVar13);
          if (1.0 <= s_tol) {
            if (1000.0 < s_tol) {
              s_tol = 1000.0;
            }
          }
          else {
            s_tol = 1.0;
          }
          dStack_1f0 = (ABS(s1) + ABS(s) + ABS(s1 - s)) * 2.3283064365386963e-10 * s_tol;
          if (t_tol <= tmax + e) {
            if (s1 <= s) {
              s1 = s1 + dStack_1f0;
            }
            else {
              s = s + dStack_1f0;
            }
          }
          if (dStack_1b0 - e <= t_tol) {
            if (s1 <= s) {
              s = s - dStack_1f0;
            }
            else {
              s1 = s1 - dStack_1f0;
            }
          }
          uVar7 = (*(((ON_Geometry *)&local_1c0->_vptr_ON_Object)->super_ON_Object)._vptr_ON_Object
                    [0x36])(s1,s,SUB84(cos_angle_tolerance,0),curvature_tolerance,local_1c0,
                            (ulong)cVar5,&stack0xfffffffffffffea8,&segment_index,dtype);
          sdom.m_t[1]._7_1_ = (bool)((byte)uVar7 & 1);
          if ((uVar7 & 1) != 0) {
            t_tol = ON_Interval::TransformParameterTo
                              ((ON_Interval *)&segment_hint,(ON_Interval *)(cdom.m_t + 1),dStack_158
                              );
            if ((t_tol <= tmax) || (dStack_1b0 <= t_tol)) {
              sdom.m_t[1]._7_1_ = false;
            }
          }
        }
      }
      if (sdom.m_t[1]._7_1_ != false) {
        if ((t != (double *)0x0) && (*t = t_tol, hint != (int *)0x0)) {
          *hint = segtol._4_4_ | segment_index << 0xe;
        }
        goto LAB_007fdf08;
      }
    }
    crv1._4_4_ = segtol._4_4_ + crv._4_4_;
    if ((crv1._4_4_ < 0) || (curve_hint <= crv1._4_4_)) goto LAB_007fdf08;
    ppOVar9 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,crv1._4_4_);
    crv0_t = (double)*ppOVar9;
    if ((ON_Curve *)crv0_t == (ON_Curve *)0x0) goto LAB_007fdf08;
    if (t1_local <= t1) {
      pdVar8 = ON_Interval::operator[]((ON_Interval *)(cdom.m_t + 1),1);
      if (t1 <= *pdVar8) goto LAB_007fdf08;
    }
    else {
      pdVar8 = ON_Interval::operator[]((ON_Interval *)(cdom.m_t + 1),0);
      if (*pdVar8 <= t1) goto LAB_007fdf08;
    }
    if (t1_local <= t1) {
      pdVar8 = ON_Interval::operator[]((ON_Interval *)&segment_hint,1);
      crv1_t = *pdVar8;
      adVar17 = (double  [2])(**(code **)(*(long *)crv0_t + 0x128))();
      auVar15._0_8_ = adVar17[1];
      auVar15._8_8_ = extraout_XMM1_Qb_00;
      local_238.m_t = adVar17;
      pdVar8 = ON_Interval::operator[](&local_238,0);
      dStack_210 = *pdVar8;
      local_214 = -1;
    }
    else {
      pdVar8 = ON_Interval::operator[]((ON_Interval *)&segment_hint,0);
      crv1_t = *pdVar8;
      adVar17 = (double  [2])(**(code **)(*(long *)crv0_t + 0x128))();
      auVar15._0_8_ = adVar17[1];
      auVar15._8_8_ = extraout_XMM1_Qb;
      local_228.m_t = adVar17;
      pdVar8 = ON_Interval::operator[](&local_228,1);
      dStack_210 = *pdVar8;
      local_214 = 1;
    }
    if (cVar5 == C1_continuous) {
LAB_007fd849:
      ON_Curve::Ev1Der((ON_Curve *)local_1c0,crv1_t,(ON_3dPoint *)&Pp.z,(ON_3dVector *)&D1p.z,
                       local_214,(int *)0x0);
      ON_Curve::Ev1Der((ON_Curve *)crv0_t,dStack_210,(ON_3dPoint *)&D1m.z,(ON_3dVector *)&D2m.z,
                       -local_214,(int *)0x0);
      if (cVar5 == C1_continuous) {
        ON_3dVector::operator-(&local_250,(ON_3dVector *)&D1p.z,(ON_3dVector *)&D2m.z);
        dVar12 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&D1p.z);
        auVar15 = ZEXT816(0x3e500000000002c4);
        bVar4 = ON_3dVector::IsTiny(&local_250,dVar12 * 1.490116119385e-08);
        if (((bVar4 ^ 0xffU) & 1) != 0) {
          sdom.m_t[1]._7_1_ = true;
        }
      }
      else {
        Tp.z = D1p.z;
        Tm.x = D1m.x;
        Tm.y = D1m.y;
        Km.z = D2m.z;
        Tp.x = D1p.x;
        Tp.y = D1p.y;
        ON_3dVector::Unitize((ON_3dVector *)&Tp.z);
        ON_3dVector::Unitize((ON_3dVector *)&Km.z);
        dVar12 = ON_3dVector::operator*((ON_3dVector *)&Tp.z,(ON_3dVector *)&Km.z);
        auVar15._8_4_ = (int)extraout_XMM0_Qb;
        auVar15._0_8_ = dVar12;
        auVar15._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        if (dVar12 < cos_angle_tolerance) {
          sdom.m_t[1]._7_1_ = true;
        }
      }
      if ((sdom.m_t[1]._7_1_ != false) && (dtype != (int *)0x0)) {
        *dtype = 1;
      }
    }
    else if (cVar5 == C2_continuous) {
LAB_007fd9a9:
      ON_Curve::Ev2Der((ON_Curve *)local_1c0,crv1_t,(ON_3dPoint *)&Pp.z,(ON_3dVector *)&D1p.z,
                       (ON_3dVector *)&D2p.z,local_214,(int *)0x0);
      ON_Curve::Ev2Der((ON_Curve *)crv0_t,dStack_210,(ON_3dPoint *)&D1m.z,(ON_3dVector *)&D2m.z,
                       (ON_3dVector *)&Tm.z,-local_214,(int *)0x0);
      if (cVar5 == C2_continuous) {
        ON_3dVector::operator-(&local_268,(ON_3dVector *)&D1p.z,(ON_3dVector *)&D2m.z);
        dVar12 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&D1p.z);
        auVar15 = ZEXT816(0x3e500000000002c4);
        bVar4 = ON_3dVector::IsTiny(&local_268,dVar12 * 1.490116119385e-08);
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          ON_3dVector::operator-
                    ((ON_3dVector *)local_280,(ON_3dVector *)&D2p.z,(ON_3dVector *)&Tm.z);
          dVar12 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&D2p.z);
          auVar15 = ZEXT816(0x3e500000000002c4);
          bVar4 = ON_3dVector::IsTiny((ON_3dVector *)local_280,dVar12 * 1.490116119385e-08);
          if ((((bVar4 ^ 0xffU) & 1) != 0) && (sdom.m_t[1]._7_1_ = true, dtype != (int *)0x0)) {
            *dtype = 2;
          }
        }
        else {
          sdom.m_t[1]._7_1_ = true;
          if (dtype != (int *)0x0) {
            *dtype = 1;
          }
        }
      }
      else {
        ON_EvCurvature((ON_3dVector *)&D1p.z,(ON_3dVector *)&D2p.z,(ON_3dVector *)&Tp.z,
                       (ON_3dVector *)&Kp.z);
        ON_EvCurvature((ON_3dVector *)&D2m.z,(ON_3dVector *)&Tm.z,(ON_3dVector *)&Km.z,
                       (ON_3dVector *)&s0);
        dVar12 = ON_3dVector::operator*((ON_3dVector *)&Tp.z,(ON_3dVector *)&Km.z);
        auVar15._8_4_ = (int)extraout_XMM0_Qb_00;
        auVar15._0_8_ = dVar12;
        auVar15._12_4_ = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
        if (cos_angle_tolerance <= dVar12) {
          if (cVar5 == Gsmooth_continuous) {
            auVar15._8_8_ = 0;
            auVar15._0_8_ = curvature_tolerance;
            Km_00.y = Km.x;
            Km_00.x = Kp.z;
            Km_00.z = Km.y;
            Kp_00.y = Kp.x;
            Kp_00.x = s0;
            Kp_00.z = Kp.y;
            local_3bd = ON_IsGsmoothCurvatureContinuous
                                  (Km_00,Kp_00,cos_angle_tolerance,curvature_tolerance);
          }
          else {
            auVar15._8_8_ = 0;
            auVar15._0_8_ = curvature_tolerance;
            Km_01.y = Km.x;
            Km_01.x = Kp.z;
            Km_01.z = Km.y;
            Kp_01.y = Kp.x;
            Kp_01.x = s0;
            Kp_01.z = Kp.y;
            local_3bd = ON_IsG2CurvatureContinuous
                                  (Km_01,Kp_01,cos_angle_tolerance,curvature_tolerance);
          }
          local_281 = local_3bd;
          if ((local_3bd != false) && (cVar5 == Gsmooth_continuous)) {
            pOVar10 = ON_ArcCurve::Cast(local_1c0);
            if (pOVar10 != (ON_ArcCurve *)0x0) {
              pOVar11 = ON_ArcCurve::Cast((ON_Object *)crv0_t);
              if (pOVar11 != (ON_ArcCurve *)0x0) {
                auVar15._8_8_ = 0;
                auVar15._0_8_ = curvature_tolerance;
                bVar4 = ON_ArcToArcTransitionIsNotGsmooth
                                  (&pOVar10->m_arc,&pOVar11->m_arc,cos_angle_tolerance,
                                   curvature_tolerance);
                if (bVar4) {
                  local_281 = false;
                }
              }
            }
          }
          if (local_281 == false) {
            sdom.m_t[1]._7_1_ = true;
            if (dtype != (int *)0x0) {
              *dtype = 2;
            }
          }
          else if (cVar5 == Gsmooth_continuous) {
            if (local_214 < 0) {
              seg1 = (ON_Curve *)local_1c0;
              _tindex = (ON_Object *)crv0_t;
            }
            else {
              seg1 = (ON_Curve *)crv0_t;
              _tindex = local_1c0;
            }
            bVar4 = ON_Curve::LastSpanIsLinear(seg1,1e-08,1e-08);
            auVar15 = ZEXT816(0x3e45798ee2308c3a);
            bVar3 = ON_Curve::FirstSpanIsLinear((ON_Curve *)_tindex,1e-08,1e-08);
            if ((bVar4 != bVar3) && (sdom.m_t[1]._7_1_ = true, dtype != (int *)0x0)) {
              *dtype = 3;
            }
          }
        }
        else {
          sdom.m_t[1]._7_1_ = true;
          if (dtype != (int *)0x0) {
            *dtype = 1;
          }
        }
      }
    }
    else {
      if (cVar5 == G1_continuous) goto LAB_007fd849;
      if ((cVar5 == G2_continuous) || (cVar5 == Gsmooth_continuous)) goto LAB_007fd9a9;
    }
    if (sdom.m_t[1]._7_1_ != false) {
      if (t1_local <= t1) {
        local_3c4 = segtol._4_4_ + C0_continuous;
      }
      else {
        local_3c4 = segtol._4_4_;
      }
      if (t != (double *)0x0) {
        pdVar8 = ON_SimpleArray<double>::operator[](&this->m_t,local_3c4);
        *t = *pdVar8;
      }
      if (hint != (int *)0x0) {
        *hint = local_3c4;
      }
LAB_007fdf08:
      if (sdom.m_t[1]._7_1_ != false) {
        return sdom.m_t[1]._7_1_;
      }
      if (local_190 == cVar5) {
        return false;
      }
      bVar4 = ON_Curve::GetNextDiscontinuity
                        (&this->super_ON_Curve,local_190,t1_local,t1,t,(int *)0x0,dtype,
                         cos_angle_tolerance,curvature_tolerance);
      return bVar4;
    }
    segtol._4_4_ = crv._4_4_ + segtol._4_4_;
  } while( true );
}

Assistant:

bool ON_PolyCurve::GetNextDiscontinuity( 
        ON::continuity c,
        double t0,
        double t1,
        double* t,
        int* hint,
        int* dtype,
        double cos_angle_tolerance,
        double curvature_tolerance
        ) const
{
  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km, Kp;
  double s0, s1, s;
  bool rc = false;
  ON_Interval sdom, cdom;
  const int count = Count();
  int segment_hint=0, curve_hint=0;
  if ( dtype )
    *dtype = 0;
  if ( count > 0 && t0 != t1 ) 
  {
    // 20 March 2003 Dale Lear:
    //     look for parametric discontinuities on the interior.
    //     If we don't find any, then well check for locus 
    //     discontinuities at the appropriate end
    ON::continuity input_c = c;
    c = ON::ParametricContinuity((int)c);

    segment_hint = (hint) ? (*hint & 0x3FFF) : 0;
    int segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t0,(t0>t1)?-1:1,segment_hint);
    curve_hint = ( hint && segment_hint == segment_index ) ? ((*hint)>>14) : 0;


    {
      // 20 March 2003 Dale Lear:
      //     If t0 is very near interior m_t[] value, see if it
      //     should be set to that value.  A bit or two of 
      //     precision sometimes gets lost in proxy
      //     domain to real curve domain conversions on the interior
      //     of a curve domain.
      double segtol = (fabs(m_t[segment_index]) + fabs(m_t[segment_index+1]) + fabs(m_t[segment_index+1]-m_t[segment_index]))*ON_SQRT_EPSILON;
      if ( m_t[segment_index]+segtol < m_t[segment_index+1]-segtol )
      {
        if ( t0 < t1 )
        {
          if ( t0 < m_t[segment_index+1] && t1 > m_t[segment_index+1] && fabs(t0-m_t[segment_index+1]) <= segtol && segment_index+1 < count )
          {
            t0 = m_t[segment_index+1];
            segment_index = ON_NurbsSpanIndex(2,count+1,m_t,t0,1,segment_hint);
          }
        }
        else
        {
          if ( t0 > m_t[segment_index] && t1 < m_t[segment_index] && fabs(t0-m_t[segment_index]) <= segtol && segment_index > 0 )
          {
            t0 = m_t[segment_index];
          }
        }
      }
    }

    double tmin, tmax;
    int segment_index_delta;
    if (t0 > t1)
    {
      segment_index_delta = -1;
      tmin = t1;
      tmax = t0;
    }
    else
    {
      segment_index_delta = 1;
      tmin = t0;
      tmax = t1;
    }

    const ON_Curve* crv;
    for ( /*empty*/; 
              segment_index >= 0 
           && segment_index < count
           && tmin < m_t[segment_index+1] && m_t[segment_index] < tmax; 
          segment_index += segment_index_delta )
    {
      crv = m_segment[segment_index];
      if ( !crv )
        break;
      
      cdom = crv->Domain();
      sdom.Set( m_t[segment_index], m_t[segment_index+1] );
      s0 = sdom.TransformParameterTo(cdom, t0);
      s1 = sdom.TransformParameterTo(cdom, t1);
      rc = crv->GetNextDiscontinuity( c, s0, s1, &s, &curve_hint, dtype, cos_angle_tolerance, curvature_tolerance );
      if ( rc )
      {
        double kink_t;
        if ( sdom == cdom )
        {
          kink_t = s;
        }
        else
        {
          kink_t = cdom.TransformParameterTo(sdom, s);
          double t_tol = (fabs(t0)+fabs(t1)+fabs(t0-t1))*ON_ZERO_TOLERANCE;
          if ( kink_t <= tmin+t_tol || kink_t >= tmax-t_tol)
          {
            // 24 January 2002 Dale Lear -
            // It is possible that lost precision in the 
            // domain conversion is giving us trouble.
            // In particular, if this code is not here,
            // "t0" is right at a kink, and s0 gets bumped
            // down a little bit due to rounding/truncation,
            // we end up finding the kink at "t0" that we were
            // supposed to skip.
            double e = fabs(sdom.Length()/cdom.Length());
            if ( e < 1.0 ) e = 1.0; else if (e > 1000.0) e = 1000.0;
            double s_tol = (fabs(s0)+fabs(s1)+fabs(s0-s1))*ON_ZERO_TOLERANCE*e;
            if ( kink_t <= tmin+t_tol )
            {
              if( s0>s1 )
                s1 = s1 + s_tol;
              else
                s0 = s0 + s_tol;
            }
            if ( kink_t >= tmax-t_tol )
            {
              if ( s0>s1 )
                s0 = s0 - s_tol;
              else
                s1 = s1 - s_tol;
            }
            rc = crv->GetNextDiscontinuity( c, s0, s1, &s, &curve_hint, dtype, cos_angle_tolerance, curvature_tolerance );
            if (rc)
            {
              kink_t = cdom.TransformParameterTo(sdom, s);
              if ( kink_t <= tmin || kink_t >= tmax )
                rc = false;
            }
          }
        }

        if (rc)
        {
          if ( t )
          {
            *t = kink_t;
            if ( hint )
            {
              *hint = segment_index | (curve_hint<<14);
            }
          }
          break;
        }
      }


      // check for discontinuity between curve segments
      int next_segment_index = segment_index+segment_index_delta;
      if ( next_segment_index < 0 || next_segment_index >= count )
      {
        // no more curve segments in search interval
        break;
      }
      const ON_Curve* crv1 = m_segment[next_segment_index];
      if ( !crv1 )
        break;

      if ( t0 > t1 )
      {
        if ( sdom[0] <= t1 ) // this line is correct - search is decreasing towards t1
        {
          // INTERIOR of search interval does not include 
          // start this crv = end of next curve
          break;
        }
      }
      else
      {
        if ( t1 <= sdom[1] )
        {
          // INTERIOR of search interval does not include 
          // end of this crv = start of next curve
          break;
        }
      }

      double crv0_t, crv1_t;
      int crv0_side;
      if ( t0 > t1 )
      {
        // compare start if this curve against end of next curve
        crv0_t = cdom[0];
        crv1_t = crv1->Domain()[1];
        crv0_side = 1;
      }
      else
      {
        // compare end if this curve against start of next curve
        crv0_t = cdom[1];
        crv1_t = crv1->Domain()[0];
        crv0_side = -1;
      }

      switch( c )
      {
      case ON::continuity::C1_continuous:
      case ON::continuity::G1_continuous:
        crv->Ev1Der( crv0_t, Pm, D1m, crv0_side );   // point on this curve
        crv1->Ev1Der( crv1_t, Pp, D1p, -crv0_side ); // corresponding point on next curve
        if ( c == ON::continuity::C1_continuous )
        {
          if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) )
            rc = true;
        }
        else
        {
          Tm = D1m;
          Tp = D1p;
          Tm.Unitize();
          Tp.Unitize();
          if ( Tm*Tp < cos_angle_tolerance )
            rc = true;
        }
        if ( rc && dtype )
          *dtype = 1;
        break;

      case ON::continuity::C2_continuous:
      case ON::continuity::G2_continuous:
      case ON::continuity::Gsmooth_continuous:
        crv->Ev2Der( crv0_t, Pm, D1m, D2m, crv0_side );   // point on this curve
        crv1->Ev2Der( crv1_t, Pp, D1p, D2p, -crv0_side ); // corresponding point on next curve
        if ( c == ON::continuity::C2_continuous )
        {
          if ( !(D1m-D1p).IsTiny(D1m.MaximumCoordinate()*ON_SQRT_EPSILON) ) 
          {
            rc = true;
            if ( dtype )
              *dtype = 1;
          }
          else if ( !(D2m-D2p).IsTiny(D2m.MaximumCoordinate()*ON_SQRT_EPSILON) )
          {
            rc = true;
            if ( dtype )
              *dtype = 2;
          }
        }
        else
        {
          ON_EvCurvature( D1m, D2m, Tm, Km );
          ON_EvCurvature( D1p, D2p, Tp, Kp );
          if ( Tm*Tp < cos_angle_tolerance )
          {
            rc = true;
            if ( dtype )
              *dtype = 1;
          }
          else 
          {
            bool bIsCurvatureContinuous = ( ON::continuity::Gsmooth_continuous == c )
              ? ON_IsGsmoothCurvatureContinuous(Km, Kp, cos_angle_tolerance, curvature_tolerance)
              : ON_IsG2CurvatureContinuous(Km, Kp, cos_angle_tolerance, curvature_tolerance);
            if ( bIsCurvatureContinuous &&  ON::continuity::Gsmooth_continuous == c )
            {
              // This fixex http://dev.mcneel.com/bugtrack/?q=116273
              const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(crv);
              if ( 0 != arc0 )
              {
                const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(crv1);
                if ( 0 != arc1 )
                {
                  // 6 November, 2012 Dale Lear
                  //   Fix bug 116273
                  //   by breaking when adjacent, tangent coplanar arcs
                  //   are visually different.
                  if ( ON_ArcToArcTransitionIsNotGsmooth(arc0->m_arc,arc1->m_arc, cos_angle_tolerance, curvature_tolerance ) )
                    bIsCurvatureContinuous = false;
                }
              }
            }
            if ( !bIsCurvatureContinuous )
            {
              // NOTE:
              //   The test to enter this scope must exactly match
              //   the one used in ON_NurbsCurve::GetNextDiscontinuity().
              rc = true;
              if ( dtype )
                *dtype = 2;
            }
            else if ( ON::continuity::Gsmooth_continuous == c )
            {
              const double is_linear_tolerance = 1.0e-8;  
              const double is_linear_min_length = 1.0e-8;
              const ON_Curve* seg0;
              const ON_Curve* seg1;
              if (crv0_side<0)
              {
                seg0 = crv;
                seg1 = crv1;
              }
              else
              {
                seg0 = crv1;
                seg1 = crv;
              }
              bool b0 = seg0->LastSpanIsLinear(is_linear_min_length,is_linear_tolerance);
              bool b1 = seg1->FirstSpanIsLinear(is_linear_min_length,is_linear_tolerance);
              if ( b0 != b1 )
              {
                rc = true;
                if ( dtype )
                  *dtype = 3;
              }
            }
          }
        }
        break;
      default:
        // intentionally ignoring other ON::continuity enum values
        break;
      }
      if (rc)
      {
        int tindex = (t0>t1)?segment_index:(segment_index+1); 
        if ( t )
          *t = m_t[tindex];
        if ( hint )
        {
          *hint = tindex;
        }
        break;
      }
    }

    if ( !rc && input_c != c )
    {
      // 20 March 2003 Dale Lear
      //   See if we need to do a locus check at an end
      rc = ON_Curve::GetNextDiscontinuity( input_c, 
                        t0, t1, t, nullptr, 
                        dtype, 
                        cos_angle_tolerance, curvature_tolerance );
    }
  }
  return rc;
}